

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::OneMinusTessCoordComponentCase::checkTessCoordComponent
          (OneMinusTessCoordComponentCase *this,float component)

{
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_1a0;
  float local_1c;
  OneMinusTessCoordComponentCase *pOStack_18;
  float component_local;
  OneMinusTessCoordComponentCase *this_local;
  
  if ((component != 1.0) || (NAN(component))) {
    local_1c = component;
    pOStack_18 = this;
    this_00 = tcu::TestContext::getLog
                        ((this->super_TessCoordComponentInvarianceCase).super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_1a0,
                         (char (*) [91])
                         "Failure: comp + (1.0-comp) doesn\'t equal 1.0 for some component of tessellation coordinate"
                        );
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool checkTessCoordComponent (float component) const
	{
		if (component != 1.0f)
		{
			m_testCtx.getLog() << TestLog::Message << "Failure: comp + (1.0-comp) doesn't equal 1.0 for some component of tessellation coordinate" << TestLog::EndMessage;
			return false;
		}
		return true;
	}